

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O3

int SSL_CREDENTIAL_set1_cert_chain(SSL_CREDENTIAL *cred,CRYPTO_BUFFER **certs,size_t num_certs)

{
  tuple<crypto_buffer_st_*,_bssl::internal::Deleter> buf;
  _Head_base<0UL,_crypto_buffer_st_*,_false> buf_00;
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_40;
  UniquePtr<CRYPTO_BUFFER> local_38;
  
  if (cred->type < kSPAKE2PlusV1Client) {
    if (num_certs != 0) {
      buf.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)*certs;
      if (buf.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
          (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
        CRYPTO_BUFFER_up_ref
                  ((CRYPTO_BUFFER *)
                   buf.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
      }
      local_38._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           buf.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      bVar1 = ssl_credential_st::SetLeafCert(cred,&local_38,false);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
      if (!bVar1) {
        return 0;
      }
      ssl_credential_st::ClearIntermediateCerts(cred);
      if (num_certs == 1) {
        return 1;
      }
      uVar4 = 2;
      bVar1 = false;
      do {
        buf_00._M_head_impl = certs[uVar4 - 1];
        if ((_Head_base<0UL,_crypto_buffer_st_*,_false>)buf_00._M_head_impl !=
            (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
          CRYPTO_BUFFER_up_ref(buf_00._M_head_impl);
        }
        local_40._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
             (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)buf_00._M_head_impl;
        bVar2 = ssl_credential_st::AppendIntermediateCert
                          (cred,(UniquePtr<CRYPTO_BUFFER> *)&local_40);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_40);
        if (!bVar2) break;
        bVar1 = num_certs <= uVar4;
        lVar3 = (1 - num_certs) + uVar4;
        uVar4 = uVar4 + 1;
      } while (lVar3 != 1);
      return (uint)bVar1;
    }
  }
  else if (1 < cred->type - kSPAKE2PlusV1Client) {
    abort();
  }
  ERR_put_error(0x10,0,0x42,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                ,0x17c);
  return 0;
}

Assistant:

int SSL_CREDENTIAL_set1_cert_chain(SSL_CREDENTIAL *cred,
                                   CRYPTO_BUFFER *const *certs,
                                   size_t num_certs) {
  if (!cred->UsesX509() || num_certs == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  if (!cred->SetLeafCert(UpRef(certs[0]), /*discard_key_on_mismatch=*/false)) {
    return 0;
  }

  cred->ClearIntermediateCerts();
  for (size_t i = 1; i < num_certs; i++) {
    if (!cred->AppendIntermediateCert(UpRef(certs[i]))) {
      return 0;
    }
  }

  return 1;
}